

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_importFilesWithSameName_Test::~Importer_importFilesWithSameName_Test
          (Importer_importFilesWithSameName_Test *this)

{
  Importer_importFilesWithSameName_Test *this_local;
  
  ~Importer_importFilesWithSameName_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, importFilesWithSameName)
{
    // This test is to see whether the importer correctly resolves imported sources, where
    // the imported files all have the same file name.

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/model.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();

    // Manually add a model to the library with the "model.cellml" key.
    auto anotherModel = libcellml::Model::create("anotherModelWithKey_model.cellml");
    anotherModel->addComponent(libcellml::Component::create("b"));
    anotherModel->addUnits(libcellml::Units::create("a"));
    importer->addModel(anotherModel, "model.cellml");

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());

    // 4 items in the library.
    EXPECT_EQ(size_t(4), importer->libraryCount());

    EXPECT_FALSE(model->hasUnresolvedImports());

    // Compare the library items against their model name to be sure they're different.
    std::vector<std::string> modelNames = {"layer3_model", "layer2_model", "layer1_model", "anotherModelWithKey_model.cellml"};
    for (size_t i = 0; i < importer->libraryCount(); ++i) {
        EXPECT_EQ(modelNames[i], importer->library(i)->name());
    }
}